

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O1

void Assimp::IFC::ExtractVerticesFromClipper
               (Polygon *poly,
               vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *temp_contour,
               bool filter_duplicates)

{
  pointer *ppaVar1;
  pointer paVar2;
  pointer pIVar3;
  pointer paVar4;
  iterator __position;
  bool bVar5;
  pointer paVar6;
  IntPoint *point;
  pointer pIVar7;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *__range2;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  aiVector2t<double> local_38;
  
  paVar2 = (temp_contour->
           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((temp_contour->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != paVar2) {
    (temp_contour->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = paVar2;
  }
  pIVar7 = (poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pIVar3 = (poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pIVar7 == pIVar3) {
      return;
    }
    dVar11 = (double)pIVar7->X / 1518500249.0;
    dVar10 = (double)pIVar7->Y / 1518500249.0;
    dVar12 = 0.0;
    if (0.0 <= dVar11) {
      dVar12 = dVar11;
    }
    dVar11 = 0.0;
    if (0.0 <= dVar10) {
      dVar11 = dVar10;
    }
    uVar8 = 0;
    uVar9 = 0x3ff00000;
    if (dVar12 <= 1.0) {
      uVar8 = SUB84(dVar12,0);
      uVar9 = (undefined4)((ulong)dVar12 >> 0x20);
    }
    local_38.y = 1.0;
    if (dVar11 <= 1.0) {
      local_38.y = dVar11;
    }
    local_38.x = (double)CONCAT44(uVar9,uVar8);
    if (filter_duplicates) {
      paVar2 = (temp_contour->
               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl
               .super__Vector_impl_data._M_start;
      paVar4 = (temp_contour->
               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl
               .super__Vector_impl_data._M_finish;
      bVar5 = paVar2 != paVar4;
      if (paVar2 == paVar4) {
LAB_005d9180:
        if (!bVar5) goto LAB_005d9184;
      }
      else {
        dVar11 = paVar2->x - (double)CONCAT44(uVar9,uVar8);
        dVar12 = paVar2->y - local_38.y;
        if (9.999999747378752e-06 <= dVar11 * dVar11 + dVar12 * dVar12) {
          do {
            paVar6 = paVar2 + 1;
            bVar5 = paVar6 != paVar4;
            if (paVar6 == paVar4) break;
            dVar11 = paVar6->x - (double)CONCAT44(uVar9,uVar8);
            dVar12 = paVar2[1].y - local_38.y;
            paVar2 = paVar6;
          } while (9.999999747378752e-06 <= dVar11 * dVar11 + dVar12 * dVar12);
          goto LAB_005d9180;
        }
      }
    }
    else {
LAB_005d9184:
      __position._M_current =
           (temp_contour->
           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (temp_contour->
          super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
        _M_realloc_insert<aiVector2t<double>const&>
                  ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)temp_contour,
                   __position,&local_38);
      }
      else {
        (__position._M_current)->x = local_38.x;
        (__position._M_current)->y = local_38.y;
        ppaVar1 = &(temp_contour->
                   super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
    }
    pIVar7 = pIVar7 + 1;
  } while( true );
}

Assistant:

void ExtractVerticesFromClipper(const ClipperLib::Polygon& poly, std::vector<IfcVector2>& temp_contour,
    bool filter_duplicates = false)
{
    temp_contour.clear();
    for(const ClipperLib::IntPoint& point : poly) {
        IfcVector2 vv = IfcVector2( from_int64(point.X), from_int64(point.Y));
        vv = std::max(vv,IfcVector2());
        vv = std::min(vv,one_vec);

        if (!filter_duplicates || !IsDuplicateVertex(vv, temp_contour)) {
            temp_contour.push_back(vv);
        }
    }
}